

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void INT_CMreturn_buffer(CManager_conflict cm,void *data)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  pthread_t pVar4;
  void *in_RSI;
  CManager_conflict in_RDI;
  CMTraceType in_stack_0000000c;
  timespec ts;
  CMbuffer buf;
  CManager_conflict in_stack_ffffffffffffffd0;
  timespec local_28;
  CMbuffer local_18;
  void *local_10;
  CManager_conflict local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = cm_buffer_lookup(in_RDI,in_RSI);
  if (local_18 == (CMbuffer)0x0) {
    fprintf(_stderr,"Error: INT_CMreturn_buffer called with record %p not associated with cm\n",
            local_10);
    cm_buffer_dump_list(in_stack_ffffffffffffffd0);
  }
  else {
    iVar1 = CMtrace_val[9];
    if (local_8->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init((CManager)ts.tv_sec,in_stack_0000000c);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        __stream = (FILE *)local_8->CMTrace_file;
        _Var2 = getpid();
        lVar3 = (long)_Var2;
        pVar4 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",lVar3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_28);
        fprintf((FILE *)local_8->CMTrace_file,"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
      }
      fprintf((FILE *)local_8->CMTrace_file,
              "CMreturn_buffer, data %p found buffer %p, ref_count now %d, calling cm_return_data_buf\n"
              ,local_10,local_18,(ulong)(uint)local_18->ref_count);
    }
    fflush((FILE *)local_8->CMTrace_file);
    cm_return_data_buf((CManager_conflict)buf,(CMbuffer)ts.tv_nsec);
  }
  return;
}

Assistant:

extern void
 INT_CMreturn_buffer(CManager cm, void *data)
 {
     CMbuffer buf = cm_buffer_lookup(cm, data);
     if (buf == NULL) {
	 fprintf(stderr, "Error: INT_CMreturn_buffer called with record %p not associated with cm\n", data);
	 cm_buffer_dump_list(cm);
	 return;
     }
     CMtrace_out(cm, CMBufferVerbose, "CMreturn_buffer, data %p found buffer %p, ref_count now %d, calling cm_return_data_buf\n", data, buf, buf->ref_count);
     cm_return_data_buf(cm, buf);
 }